

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

string * __thiscall
t_cpp_generator::render_const_value
          (string *__return_storage_ptr__,t_cpp_generator *this,ostream *out,string name,
          t_type *type,t_const_value *value)

{
  uint uVar1;
  char cVar2;
  t_const_value_type tVar3;
  ostream *poVar4;
  int64_t iVar5;
  ostringstream *this_00;
  ulong uVar6;
  char *pcVar7;
  t_const_value *in_R9;
  undefined1 auVar8 [12];
  ostringstream render;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  this_00 = (ostringstream *)local_1a8;
  std::__cxx11::ostringstream::ostringstream(this_00);
  cVar2 = (**(code **)(*(long *)&(value->mapVal_)._M_t._M_impl + 0x28))(value);
  if (cVar2 == '\0') {
    cVar2 = (**(code **)(*(long *)&(value->mapVal_)._M_t._M_impl + 0x50))(value);
    if (cVar2 == '\0') {
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"tmp","");
      t_generator::tmp(&local_228,(t_generator *)this,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      poVar4 = t_generator::indent((t_generator *)this,out);
      type_name_abi_cxx11_(&local_208,this,(t_type *)value,false,false);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)CONCAT71(local_208._M_dataplus._M_p._1_7_,
                                                  local_208._M_dataplus._M_p._0_1_),
                          local_208._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)CONCAT71(local_228._M_dataplus._M_p._1_7_,
                                                  local_228._M_dataplus._M_p._0_1_),
                          local_228._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_208._M_dataplus._M_p._1_7_,local_208._M_dataplus._M_p._0_1_) !=
          &local_208.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_208._M_dataplus._M_p._1_7_,local_208._M_dataplus._M_p._0_1_))
        ;
      }
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,
                 CONCAT71(local_228._M_dataplus._M_p._1_7_,local_228._M_dataplus._M_p._0_1_),
                 local_228._M_string_length +
                 CONCAT71(local_228._M_dataplus._M_p._1_7_,local_228._M_dataplus._M_p._0_1_));
      print_const_value(this,out,&local_1e8,(t_type *)value,in_R9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 (char *)CONCAT71(local_228._M_dataplus._M_p._1_7_,local_228._M_dataplus._M_p._0_1_)
                 ,local_228._M_string_length);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
      type_name_abi_cxx11_(&local_228,this,(t_type *)value,false,false);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,
                          (char *)CONCAT71(local_228._M_dataplus._M_p._1_7_,
                                           local_228._M_dataplus._M_p._0_1_),
                          local_228._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
      t_const_value::get_integer(in_R9);
      std::ostream::_M_insert<long>((long)poVar4);
    }
    goto LAB_00180d8c;
  }
  uVar1 = *(uint *)&(value->identifierVal_).field_2;
  switch(uVar1) {
  case 1:
    local_228._M_dataplus._M_p._0_1_ = 0x22;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)&local_228,1);
    t_generator::get_escaped_string_abi_cxx11_(&local_228,(t_generator *)this,in_R9);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT71(local_228._M_dataplus._M_p._1_7_,
                                                local_228._M_dataplus._M_p._0_1_),
                        local_228._M_string_length);
    local_208._M_dataplus._M_p._0_1_ = 0x22;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_208,1);
    break;
  case 2:
    iVar5 = t_const_value::get_integer(in_R9);
    pcVar7 = "false";
    if (0 < iVar5) {
      pcVar7 = "true";
    }
    uVar6 = (ulong)(0 < iVar5) ^ 5;
    goto LAB_00180de1;
  case 3:
  case 4:
  case 5:
    t_const_value::get_integer(in_R9);
    std::ostream::_M_insert<long>((long)local_1a8);
    goto LAB_00180de9;
  case 6:
    t_const_value::get_integer(in_R9);
    this_00 = (ostringstream *)std::ostream::_M_insert<long>((long)local_1a8);
    uVar6 = 2;
    pcVar7 = "LL";
LAB_00180de1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar7,uVar6);
    goto LAB_00180de9;
  case 7:
    tVar3 = t_const_value::get_type(in_R9);
    if (tVar3 == CV_INTEGER) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"static_cast<double>(",0x14);
      t_const_value::get_integer(in_R9);
      this_00 = (ostringstream *)std::ostream::_M_insert<long>((long)local_1a8);
      uVar6 = 1;
      pcVar7 = ")";
      goto LAB_00180de1;
    }
    t_generator::emit_double_as_string_abi_cxx11_(&local_228,(t_generator *)this,in_R9->doubleVal_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               (char *)CONCAT71(local_228._M_dataplus._M_p._1_7_,local_228._M_dataplus._M_p._0_1_),
               local_228._M_string_length);
    break;
  default:
    auVar8 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&local_228,(t_base_type *)(ulong)uVar1,auVar8._8_4_);
    std::operator+(auVar8._0_8_,"compiler error: no const of base type ",&local_228);
    __cxa_throw(auVar8._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
LAB_00180d8c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_228._M_dataplus._M_p._1_7_,local_228._M_dataplus._M_p._0_1_) !=
      &local_228.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_228._M_dataplus._M_p._1_7_,local_228._M_dataplus._M_p._0_1_));
  }
LAB_00180de9:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::render_const_value(ostream& out,
                                           string name,
                                           t_type* type,
                                           t_const_value* value) {
  (void)name;
  std::ostringstream render;

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      render << '"' << get_escaped_string(value) << '"';
      break;
    case t_base_type::TYPE_BOOL:
      render << ((value->get_integer() > 0) ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
      render << value->get_integer();
      break;
    case t_base_type::TYPE_I64:
      render << value->get_integer() << "LL";
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        render << "static_cast<double>(" << value->get_integer() << ")";
      } else {
        render << emit_double_as_string(value->get_double());
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    render << "(" << type_name(type) << ")" << value->get_integer();
  } else {
    string t = tmp("tmp");
    indent(out) << type_name(type) << " " << t << ";" << endl;
    print_const_value(out, t, type, value);
    render << t;
  }

  return render.str();
}